

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O2

void __thiscall FatSystem::enableCache(FatSystem *this)

{
  uint uVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  uint *puVar3;
  undefined8 uStack_28;
  
  if (this->cacheEnabled == false) {
    uStack_28 = in_RAX;
    poVar2 = std::operator<<((ostream *)&std::cout,"Computing FAT cache...");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = 0;
    while (uStack_28 = CONCAT44(uVar1,(undefined4)uStack_28),
          (ulong)(long)(int)uVar1 < this->totalClusters) {
      uVar1 = nextCluster(this,uVar1,0);
      puVar3 = (uint *)std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       operator[](&this->cache,(key_type *)((long)&uStack_28 + 4));
      *puVar3 = uVar1;
      uVar1 = uStack_28._4_4_ + 1;
    }
    this->cacheEnabled = true;
  }
  return;
}

Assistant:

void FatSystem::enableCache()
{
    if (!cacheEnabled) {
        cout << "Computing FAT cache..." << endl;
        for (int cluster=0; cluster<totalClusters; cluster++) {
            cache[cluster] = nextCluster(cluster);
        }

        cacheEnabled = true;
    }
}